

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

HighsStatus
assessCosts(HighsOptions *options,HighsInt ml_col_os,HighsIndexCollection *index_collection,
           vector<double,_std::allocator<double>_> *cost,bool *has_infinite_cost,
           double infinite_cost)

{
  const_reference pvVar1;
  reference pvVar2;
  vector<double,_std::allocator<double>_> *in_RCX;
  HighsIndexCollection *in_RDX;
  long in_RDI;
  undefined1 *in_R8;
  HighsLogOptions *in_XMM0_Qa;
  HighsInt k;
  HighsInt num_infinite_cost;
  HighsInt usr_col;
  HighsInt local_col;
  HighsInt to_k;
  HighsInt from_k;
  HighsStatus return_status;
  int local_54;
  uint local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  HighsStatus local_3c;
  HighsLogOptions *local_38;
  undefined1 *local_30;
  vector<double,_std::allocator<double>_> *local_28;
  HighsIndexCollection *local_20;
  long local_10;
  HighsStatus local_4;
  
  local_3c = kOk;
  local_38 = in_XMM0_Qa;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = in_RDI;
  limits(in_RDX,&local_40,&local_44);
  if (local_44 < local_40) {
    local_4 = local_3c;
  }
  else {
    local_3c = kOk;
    local_4c = -1;
    local_50 = 0;
    for (local_54 = local_40; local_54 < local_44 + 1; local_54 = local_54 + 1) {
      if (((local_20->is_interval_ & 1U) == 0) && ((local_20->is_mask_ & 1U) == 0)) {
        pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_20->set_,(long)local_54);
        local_48 = *pvVar1;
      }
      else {
        local_48 = local_54;
      }
      if ((local_20->is_interval_ & 1U) == 0) {
        local_4c = local_54;
      }
      else {
        local_4c = local_4c + 1;
      }
      if (((local_20->is_mask_ & 1U) == 0) ||
         (pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&local_20->mask_,(long)local_48), *pvVar1 != 0)) {
        pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_4c);
        if (*pvVar2 < (double)local_38) {
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_4c)
          ;
          if (*pvVar2 <= -(double)local_38) {
            local_50 = local_50 + 1;
            pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_28,(long)local_4c);
            *pvVar2 = -INFINITY;
          }
        }
        else {
          local_50 = local_50 + 1;
          pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](local_28,(long)local_4c)
          ;
          *pvVar2 = INFINITY;
        }
      }
    }
    if (0 < (int)local_50) {
      *local_30 = 1;
      highsLogUser(local_38,(HighsLogType)(local_10 + 0x380),(char *)0x1,
                   "%d |cost| values greater than or equal to %12g are treated as Infinity\n",
                   (ulong)local_50);
    }
    local_4 = local_3c;
  }
  return local_4;
}

Assistant:

HighsStatus assessCosts(const HighsOptions& options, const HighsInt ml_col_os,
                        const HighsIndexCollection& index_collection,
                        vector<double>& cost, bool& has_infinite_cost,
                        const double infinite_cost) {
  HighsStatus return_status = HighsStatus::kOk;
  assert(ok(index_collection));
  HighsInt from_k;
  HighsInt to_k;
  limits(index_collection, from_k, to_k);
  if (from_k > to_k) return return_status;

  return_status = HighsStatus::kOk;
  // Work through the data to be assessed.
  //
  // Loop is k \in [from_k...to_k) covering the entries in the
  // interval, set or mask to be considered.
  //
  // For an interval or mask, these values of k are the columns to be
  // considered in a local sense, as well as the entries in the
  // cost data to be assessed
  //
  // For a set, these values of k are the indices in the set, from
  // which the columns to be considered in a local sense are
  // drawn. The entries in the cost data to be assessed correspond
  // to the values of k
  //
  // Adding the value of ml_col_os to local_col yields the value of
  // ml_col, being the column in a global (whole-model) sense. This is
  // necessary when assessing the costs of columns being added to a
  // model, since they are specified using an interval
  // [0...num_new_col) which must be offset by the current number of
  // columns in the model.
  //
  HighsInt local_col;
  HighsInt usr_col = -1;
  HighsInt num_infinite_cost = 0;
  for (HighsInt k = from_k; k < to_k + 1; k++) {
    if (index_collection.is_interval_ || index_collection.is_mask_) {
      local_col = k;
    } else {
      local_col = index_collection.set_[k];
    }
    if (index_collection.is_interval_) {
      usr_col++;
    } else {
      usr_col = k;
    }
    if (index_collection.is_mask_ && !index_collection.mask_[local_col])
      continue;
    if (cost[usr_col] >= infinite_cost) {
      num_infinite_cost++;
      cost[usr_col] = kHighsInf;
    } else if (cost[usr_col] <= -infinite_cost) {
      num_infinite_cost++;
      cost[usr_col] = -kHighsInf;
    }
  }
  if (num_infinite_cost > 0) {
    has_infinite_cost = true;
    highsLogUser(options.log_options, HighsLogType::kInfo,
                 "%" HIGHSINT_FORMAT
                 " |cost| values greater than or equal to %12g are treated as "
                 "Infinity\n",
                 num_infinite_cost, infinite_cost);
  }
  return return_status;
}